

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O2

void __thiscall
baryonyx::itm::
solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
::solver_equalities_101coeff
          (solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  bound_factor *pbVar1;
  pointer pmVar2;
  pointer pfVar3;
  int *piVar4;
  pointer pmVar5;
  pointer pmVar6;
  ulong uVar7;
  long lVar8;
  pointer pfVar9;
  string_view name;
  
  name._M_str = "solver_equalities_101coeff";
  name._M_len = 0x1a;
  debug_logger<true>::debug_logger(&this->super_debug_logger<true>,name);
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  std::make_unique<double[]>((size_t)&this->P);
  std::make_unique<int[]>((size_t)&this->A);
  compute_reduced_costs_vector_size(csts);
  std::
  make_unique<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[]>
            ((size_t)&this->R);
  std::
  make_unique<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::bound_factor[]>
            ((size_t)&this->b);
  std::make_unique<double[]>((size_t)&this->pi);
  lVar8 = 0;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  pbVar1 = (this->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor_*,_false>
           ._M_head_impl;
  pmVar2 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = 0;
  do {
    if (uVar7 == (uint)this->m) {
      return;
    }
    pbVar1[uVar7].negative_factor = 0;
    lVar8 = (long)(int)lVar8;
    pbVar1[uVar7].value = pmVar2[uVar7].min;
    pfVar3 = *(pointer *)
              ((long)&pmVar2[uVar7].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl + 8);
    piVar4 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    for (pfVar9 = *(pointer *)
                   &pmVar2[uVar7].elements.
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl; pfVar9 != pfVar3; pfVar9 = pfVar9 + 1) {
      if ((pfVar9->factor + 1U & 0xfffffffd) != 0) {
        details::fail_fast("Postcondition","std::abs(cst.factor) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-equalities-101.cpp"
                           ,"103");
      }
      piVar4[lVar8] = pfVar9->factor;
      if (pfVar9->factor < 0) {
        pbVar1[uVar7].negative_factor = pbVar1[uVar7].negative_factor + 1;
      }
      lVar8 = lVar8 + 1;
    }
    pmVar5 = pmVar2 + uVar7;
    pmVar6 = pmVar2 + uVar7;
    uVar7 = uVar7 + 1;
    if (pmVar5->min != pmVar6->max) {
      details::fail_fast("Postcondition","csts[i].min == csts[i].max",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-equalities-101.cpp"
                         ,"110");
    }
  } while( true );
}

Assistant:

solver_equalities_101coeff(random_engine& rng_,
                               int m_,
                               int n_,
                               const cost_type& c_,
                               const std::vector<merged_constraint>& csts)
      : logger("solver_equalities_101coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0; i != m; ++i) {
            b[i].negative_factor = 0;
            b[i].value = csts[i].min;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);
                A[id++] = cst.factor;

                if (cst.factor < 0)
                    ++b[i].negative_factor;
            }

            bx_ensures(csts[i].min == csts[i].max);
        }
    }